

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

void Str_MuxDelayPrint_rec(Str_Mux_t *pMux,int i)

{
  Str_Mux_t *pMux_00;
  int iVar1;
  long lVar2;
  
  iVar1 = pMux->Edge[i].Fan;
  lVar2 = (long)iVar1;
  if (0 < lVar2) {
    iVar1 = pMux->Id;
    pMux_00 = pMux + (lVar2 - iVar1);
    printf("[ ");
    if (pMux[lVar2 - iVar1].Edge[0].fCompl != 0) {
      putchar(0x21);
    }
    Str_MuxDelayPrint_rec(pMux_00,0);
    putchar(0x7c);
    if (pMux_00->Edge[1].fCompl != 0) {
      putchar(0x21);
    }
    Str_MuxDelayPrint_rec(pMux_00,1);
    putchar(0x28);
    if (pMux_00->Edge[2].fCompl != 0) {
      putchar(0x21);
    }
    Str_MuxDelayPrint_rec(pMux_00,2);
    putchar(0x29);
    printf(" ]");
    return;
  }
  printf("%d",(ulong)(uint)-iVar1);
  printf("{%d}",(ulong)(uint)pMux->Edge[i].FanDel);
  return;
}

Assistant:

void Str_MuxDelayPrint_rec( Str_Mux_t * pMux, int i )
{
    int fShowDelay = 1;
    Str_Mux_t * pFanin;
    if ( pMux->Edge[i].Fan <= 0 )
    {
        printf( "%d", -pMux->Edge[i].Fan );
        if ( fShowDelay )
            printf( "{%d}", pMux->Edge[i].FanDel );
        return;
    }
    pFanin = Str_MuxFanin( pMux, i );
    printf( "[ " );
    if ( pFanin->Edge[0].fCompl )
        printf( "!" );
    Str_MuxDelayPrint_rec( pFanin, 0 );
    printf( "|" );
    if ( pFanin->Edge[1].fCompl )
        printf( "!" );
    Str_MuxDelayPrint_rec( pFanin, 1 );
    printf( "(" );
    if ( pFanin->Edge[2].fCompl )
        printf( "!" );
    Str_MuxDelayPrint_rec( pFanin, 2 );
    printf( ")" );
    printf( " ]" );
}